

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O1

void store_number(char *dest,uint number)

{
  uint uVar1;
  size_t sVar2;
  uint count;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (ulong)number;
  sVar2 = strlen(dest);
  if (number == 0) {
    iVar3 = 2;
  }
  else {
    iVar3 = 1;
    uVar6 = uVar5;
    do {
      uVar1 = (uint)uVar6;
      uVar6 = uVar6 / 10;
      iVar3 = iVar3 + 1;
    } while (9 < uVar1);
  }
  uVar4 = iVar3 + (int)sVar2;
  dest[uVar4] = '\0';
  uVar1 = ((int)sVar2 + iVar3) - 1;
  if (number == 0) {
    dest[uVar1] = '0';
    uVar1 = uVar4 - 2;
  }
  else {
    do {
      uVar4 = (uint)uVar5;
      dest[uVar1] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
      uVar1 = uVar1 - 1;
      uVar5 = uVar5 / 10;
    } while (9 < uVar4);
  }
  dest[uVar1] = '_';
  return;
}

Assistant:

void
store_number(char *dest, unsigned number)
{
  unsigned i = strlen(dest) + num_length(number);
  dest[i] = '\0';
  if (number) {
    --i;
    while (number > 0) {
      unsigned digit = number % 10;
      dest[i] = '0' + digit;
      number /= 10;
      --i;
    }
  } else {
    dest[i - 1] = '0';
    i -= 2;
  }
  dest[i] = '_';
}